

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_array.h
# Opt level: O0

void __thiscall
gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::set_capacity
          (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this,
          size_type_conflict n)

{
  uint uVar1;
  size_type_conflict sVar2;
  ostream *poVar3;
  uint local_74;
  S2LogMessage local_50;
  S2LogMessageVoidify local_3d [20];
  byte local_29;
  S2LogMessage local_28;
  S2LogMessageVoidify local_15;
  uint local_14;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *pcStack_10;
  size_type_conflict n_local;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_local;
  
  local_14 = n;
  pcStack_10 = this;
  sVar2 = size(this);
  local_29 = 0;
  if (local_14 < sVar2) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/compact_array.h"
               ,0x16c,kFatal,(ostream *)&std::cerr);
    local_29 = 1;
    poVar3 = S2LogMessage::stream(&local_28);
    poVar3 = std::operator<<(poVar3,"Check failed: (size()) <= (n) ");
    S2LogMessageVoidify::operator&(&local_15,poVar3);
  }
  if ((local_29 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
  }
  *(uint *)this = *(uint *)this & 0xbfffffff | (uint)(0x3f < local_14) << 0x1e;
  if ((*(uint *)this >> 0x1e & 1) == 0) {
    local_74 = local_14;
  }
  else {
    local_74 = Bits::Log2Ceiling(local_14);
  }
  uVar1 = local_14;
  *(uint *)this = *(uint *)this & 0xc0ffffff | (local_74 & 0x3f) << 0x18;
  sVar2 = capacity(this);
  if (uVar1 == sVar2 || local_14 != 0) {
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/compact_array.h"
             ,0x173,kFatal,(ostream *)&std::cerr);
  poVar3 = S2LogMessage::stream(&local_50);
  poVar3 = std::operator<<(poVar3,"Check failed: n == capacity() || n > kInlined ");
  S2LogMessageVoidify::operator&(local_3d,poVar3);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_50);
}

Assistant:

void set_capacity(size_type n) {
    S2_DCHECK_LE(size(), n);
    is_exponent_ = (n >= kExponentStart);
    capacity_ = is_exponent_ ? Bits::Log2Ceiling(n) : n;
    // A tiny optimization here would be to set capacity_ to kInlined if
    // it's currently less. We don't bother, because doing so would require
    // changing the existing comments and unittests that say that, for small n,
    // capacity() will be exactly n if one calls reserve(n).
    S2_DCHECK(n == capacity() || n > kInlined);
  }